

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::sectionEnded(CompactReporter *this,SectionStats *_sectionStats)

{
  double duration;
  bool bVar1;
  ostream *poVar2;
  SectionStats *this_00;
  string local_38;
  
  duration = _sectionStats->durationInSeconds;
  this_00 = _sectionStats;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase<Catch::CompactReporter>).m_config.
                             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,duration);
  if (bVar1) {
    poVar2 = (ostream *)(this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
    getFormattedDuration_abi_cxx11_(&local_38,(Catch *)this_00,duration);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)&_sectionStats->sectionInfo);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void CompactReporter::sectionEnded(SectionStats const& _sectionStats) {
            double dur = _sectionStats.durationInSeconds;
            if ( shouldShowDuration( *m_config, dur ) ) {
                stream << getFormattedDuration( dur ) << " s: " << _sectionStats.sectionInfo.name << std::endl;
            }
        }